

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderInvarianceTests::init(ShaderInvarianceTests *this,EVP_PKEY_CTX *ctx)

{
  Precision PVar1;
  Context *pCVar2;
  char *pcVar3;
  TestNode *node;
  FormatArgumentList *pFVar4;
  BasicInvarianceTest *pBVar5;
  char *name;
  ShaderInvarianceTests *pSVar6;
  PrecisionCase *args_00;
  char *pcVar7;
  char **value;
  char **value_00;
  char **value_01;
  char **value_02;
  char **value_03;
  Precision local_c74;
  string local_b20;
  string local_b00;
  undefined1 local_ad9;
  string local_ad8;
  string local_ab8;
  undefined1 local_a91;
  string local_a90;
  string local_a70;
  undefined1 local_a49;
  string local_a48;
  string local_a28;
  undefined1 local_a01;
  string local_a00;
  string local_9e0;
  undefined1 local_9ba;
  allocator<char> local_9b9;
  string local_9b8;
  FormatArgument local_998;
  allocator<char> local_969;
  string local_968;
  FormatArgument local_948;
  allocator<char> local_919;
  string local_918;
  FormatArgument local_8f8;
  allocator<char> local_8c9;
  string local_8c8;
  FormatArgument local_8a8;
  FormatArgumentList local_880;
  string local_850;
  allocator<char> local_829;
  string local_828;
  FormatArgument local_808;
  allocator<char> local_7d9;
  string local_7d8;
  FormatArgument local_7b8;
  allocator<char> local_789;
  string local_788;
  FormatArgument local_768;
  allocator<char> local_739;
  string local_738;
  FormatArgument local_718;
  FormatArgumentList local_6f0;
  string local_6c0;
  allocator<char> local_699;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  char *local_658;
  char *normalizationStrUnrelated;
  char *normalizationStrUsed;
  char *multiplierStr;
  char *pcStack_638;
  Precision minPrecision;
  char *unrelatedPrec;
  int precisionOther;
  string local_608;
  undefined1 local_5e1;
  string local_5e0;
  string local_5c0;
  undefined1 local_599;
  string local_598;
  string local_578;
  undefined1 local_551;
  string local_550;
  string local_530;
  allocator<char> local_509;
  string local_508;
  FormatArgument local_4e8;
  allocator<char> local_4b9;
  string local_4b8;
  FormatArgument local_498;
  allocator<char> local_469;
  string local_468;
  FormatArgument local_448;
  string local_420;
  FormatArgument local_400;
  string local_3d8;
  FormatArgument local_3b8;
  string local_390;
  FormatArgument local_370;
  string local_348;
  FormatArgument local_328;
  string local_300;
  FormatArgument local_2e0;
  string local_2b8;
  FormatArgument local_298;
  string local_270;
  FormatArgument local_250;
  string local_228;
  FormatArgument local_208;
  allocator<char> local_1d9;
  string local_1d8;
  FormatArgument local_1b8;
  allocator<char> local_189;
  string local_188;
  FormatArgument local_168;
  allocator<char> local_139;
  string local_138;
  FormatArgument local_118;
  allocator<char> local_e9;
  string local_e8;
  FormatArgument local_c8;
  FormatArgumentList local_a0;
  undefined1 local_70 [8];
  FormatArgumentList args;
  TestCaseGroup *group;
  Precision precision;
  char *precisionName;
  int precNdx;
  ShaderInvarianceTests *this_local;
  
  precisionName._4_4_ = 0;
  pSVar6 = this;
  while ((int)precisionName._4_4_ < 3) {
    pcVar7 = init::precisions[(int)precisionName._4_4_].name;
    PVar1 = init::precisions[(int)precisionName._4_4_].prec;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,pcVar7,
               "Invariance tests using the given precision.");
    anon_unknown_1::FormatArgumentList::FormatArgumentList(&local_a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"#version 300 es\n",&local_e9);
    anon_unknown_1::FormatArgument::FormatArgument(&local_c8,"VERSION",&local_e8);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(&local_a0,&local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"in",&local_139);
    anon_unknown_1::FormatArgument::FormatArgument(&local_118,"IN",&local_138);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_118);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"out",&local_189);
    anon_unknown_1::FormatArgument::FormatArgument(&local_168,"OUT",&local_188);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_168);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,pcVar7,&local_1d9);
    anon_unknown_1::FormatArgument::FormatArgument(&local_1b8,"IN_PREC",&local_1d8);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_1b8);
    de::toString<char_const*>
              (&local_228,(de *)&init::precisions[(int)precisionName._4_4_].highValue,value);
    anon_unknown_1::FormatArgument::FormatArgument(&local_208,"HIGH_VALUE",&local_228);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_208);
    de::toString<char_const*>
              (&local_270,(de *)&init::precisions[(int)precisionName._4_4_].invHighValue,value_00);
    anon_unknown_1::FormatArgument::FormatArgument(&local_250,"HIGH_VALUE_INV",&local_270);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_250);
    de::toString<char_const*>
              (&local_2b8,(de *)&init::precisions[(int)precisionName._4_4_].mediumValue,value_01);
    anon_unknown_1::FormatArgument::FormatArgument(&local_298,"MEDIUM_VALUE",&local_2b8);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_298);
    de::toString<char_const*>
              (&local_300,(de *)&init::precisions[(int)precisionName._4_4_].lowValue,value_02);
    anon_unknown_1::FormatArgument::FormatArgument(&local_2e0,"LOW_VALUE",&local_300);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_2e0);
    de::toString<char_const*>
              (&local_348,(de *)&init::precisions[(int)precisionName._4_4_].invlowValue,value_03);
    anon_unknown_1::FormatArgument::FormatArgument(&local_328,"LOW_VALUE_INV",&local_348);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_328);
    de::toString<int>(&local_390,&init::precisions[(int)precisionName._4_4_].loopIterations);
    anon_unknown_1::FormatArgument::FormatArgument(&local_370,"LOOP_ITERS",&local_390);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_370);
    de::toString<int>(&local_3d8,&init::precisions[(int)precisionName._4_4_].loopPartialIterations);
    anon_unknown_1::FormatArgument::FormatArgument(&local_3b8,"LOOP_ITERS_PARTIAL",&local_3d8);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_3b8);
    de::toString<int>(&local_420,
                      &init::precisions[(int)precisionName._4_4_].loopNormalizationExponent);
    anon_unknown_1::FormatArgument::FormatArgument(&local_400,"LOOP_NORM_FRACT_EXP",&local_420);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_400);
    pcVar7 = init::precisions[(int)precisionName._4_4_].loopNormalizationConstantLiteral;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,pcVar7,&local_469);
    anon_unknown_1::FormatArgument::FormatArgument(&local_448,"LOOP_NORM_LITERAL",&local_468);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_448);
    pcVar7 = init::precisions[(int)precisionName._4_4_].loopMultiplier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,pcVar7,&local_4b9);
    anon_unknown_1::FormatArgument::FormatArgument(&local_498,"LOOP_MULTIPLIER",&local_4b8);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_498);
    args_00 = init::precisions;
    pcVar7 = init::precisions[(int)precisionName._4_4_].sumLoopNormalizationConstantLiteral;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,pcVar7,&local_509);
    anon_unknown_1::FormatArgument::FormatArgument(&local_4e8,"SUM_LOOP_NORM_LITERAL",&local_508);
    pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_4e8);
    anon_unknown_1::FormatArgumentList::FormatArgumentList((FormatArgumentList *)local_70,pFVar4);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator(&local_509);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_400);
    std::__cxx11::string::~string((string *)&local_420);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    anon_unknown_1::FormatArgument::~FormatArgument(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    anon_unknown_1::FormatArgumentList::~FormatArgumentList(&local_a0);
    tcu::TestNode::addChild((TestNode *)this,node);
    pBVar5 = (BasicInvarianceTest *)operator_new(0xf8);
    local_551 = 1;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_530,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\tv_unrelated = a_input.xzxz + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * (1.08 * a_input.zyzy * a_input.xzxz) * ${HIGH_VALUE_INV} * (a_input.z * a_input.zzxz - a_input.z * a_input.zzxz) + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) / ${HIGH_VALUE};\n\tgl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n}\n"
               ,local_70,(FormatArgumentList *)args_00);
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_550,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tgl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n}\n"
               ,local_70,(FormatArgumentList *)args_00);
    pcVar7 = "Shader shares a subexpression with an unrelated variable.";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar5,pCVar2,"common_subexpression_0",
               "Shader shares a subexpression with an unrelated variable.",&local_530,&local_550);
    local_551 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string((string *)&local_530);
    pBVar5 = (BasicInvarianceTest *)operator_new(0xf8);
    local_599 = 1;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_578,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 a = ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy - ${HIGH_VALUE} * a_input.zzxx;\n\t${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n\t${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n\t${IN_PREC} vec4 d = (${LOW_VALUE} * a_input.yzxx) * (${LOW_VALUE} * a_input.yzzw) * (1.1*${LOW_VALUE_INV} * a_input.yzxx) * (${LOW_VALUE_INV} * a_input.xzzy);\n\t${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n\tv_unrelated = a + b + c + d + e;\n\tgl_Position = a_input + fract(c) + e;\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_598,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n\t${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n\t${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tgl_Position = a_input + fract(c) + e;\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    pcVar7 = "Shader shares a subexpression with an unrelated variable.";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar5,pCVar2,"common_subexpression_1",
               "Shader shares a subexpression with an unrelated variable.",&local_578,&local_598);
    local_599 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)&local_578);
    pBVar5 = (BasicInvarianceTest *)operator_new(0xf8);
    local_5e1 = 1;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_5c0,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n\t${IN_PREC} vec4 b = (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) * (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n\t${IN_PREC} vec4 c = a * a;\n\t${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n\tv_unrelated = a + b + c + d;\n\tgl_Position = a_input + d;\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_5e0,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n\t${IN_PREC} vec4 c = a * a;\n\t${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tgl_Position = a_input + d;\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    pcVar7 = "Shader shares a subexpression with an unrelated variable.";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar5,pCVar2,"common_subexpression_2",
               "Shader shares a subexpression with an unrelated variable.",&local_5c0,&local_5e0);
    local_5e1 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_5c0);
    pBVar5 = (BasicInvarianceTest *)operator_new(0xf8);
    unrelatedPrec._7_1_ = 1;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_608,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} float x = a_input.x * 0.2;\n\t${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n\t${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n\t${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n\t${IN_PREC} vec4 f = x*a + x*b + x*c;\n\tv_unrelated = f;\n\t${IN_PREC} vec4 g = x * (a + b + c);\n\tgl_Position = a_input + g;\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)&precisionOther,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} float x = a_input.x * 0.2;\n\t${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n\t${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n\t${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 g = x * (a + b + c);\n\tgl_Position = a_input + g;\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    pcVar7 = "Shader shares a subexpression with an unrelated variable.";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar5,pCVar2,"common_subexpression_3",
               "Shader shares a subexpression with an unrelated variable.",&local_608,
               (string *)&precisionOther);
    unrelatedPrec._7_1_ = 0;
    tcu::TestNode::addChild(node,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&precisionOther);
    std::__cxx11::string::~string((string *)&local_608);
    for (unrelatedPrec._0_4_ = PRECISION_LOWP; (Precision)unrelatedPrec != PRECISION_LAST;
        unrelatedPrec._0_4_ = (Precision)unrelatedPrec + PRECISION_MEDIUMP) {
      pcStack_638 = glu::getPrecisionName((Precision)unrelatedPrec);
      local_c74 = PVar1;
      if ((int)(Precision)unrelatedPrec < (int)PVar1) {
        local_c74 = (Precision)unrelatedPrec;
      }
      multiplierStr._4_4_ = local_c74;
      normalizationStrUsed = "1.0e1, 5.0e2, 2.0e2, 1.0";
      if (local_c74 == PRECISION_LOWP) {
        normalizationStrUsed = "0.8, 0.4, -0.2, 0.3";
      }
      normalizationStrUnrelated = "vec4(fract(used2 / 1.0e2).xyz - fract(used2 / 1.0e3).xyz, 0.0)";
      if (local_c74 == PRECISION_LOWP) {
        normalizationStrUnrelated = "vec4(fract(used2).xyz, 0.0)";
      }
      pcVar7 = "vec4(fract(unrelated2).xyz, 0.0)";
      local_658 = "vec4(fract(unrelated2 / 1.0e2).xyz - fract(unrelated2 / 1.0e3).xyz, 0.0)";
      if (local_c74 == PRECISION_LOWP) {
        local_658 = "vec4(fract(unrelated2).xyz, 0.0)";
      }
      pBVar5 = (BasicInvarianceTest *)operator_new(0xf8);
      pcVar3 = pcStack_638;
      local_9ba = 1;
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,pcVar3,&local_699);
      std::operator+(&local_678,"subexpression_precision_",&local_698);
      name = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::FormatArgumentList::FormatArgumentList
                (&local_6f0,(FormatArgumentList *)local_70);
      pcVar3 = pcStack_638;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,pcVar3,&local_739);
      anon_unknown_1::FormatArgument::FormatArgument(&local_718,"UNRELATED_PREC",&local_738);
      pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(&local_6f0,&local_718);
      pcVar3 = normalizationStrUsed;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,pcVar3,&local_789);
      anon_unknown_1::FormatArgument::FormatArgument(&local_768,"MULTIPLIER",&local_788);
      pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_768);
      pcVar3 = normalizationStrUnrelated;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d8,pcVar3,&local_7d9);
      anon_unknown_1::FormatArgument::FormatArgument(&local_7b8,"NORMALIZE_USED",&local_7d8);
      pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_7b8);
      pcVar3 = local_658;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_828,pcVar3,&local_829);
      anon_unknown_1::FormatArgument::FormatArgument(&local_808,"NORMALIZE_UNRELATED",&local_828);
      pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_808);
      Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
                (&local_6c0,
                 (_anonymous_namespace_ *)
                 "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${UNRELATED_PREC} vec4 unrelated0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n\t${UNRELATED_PREC} vec4 unrelated1 = vec4(${MULTIPLIER}) * unrelated0.xywz + unrelated0;\n\t${UNRELATED_PREC} vec4 unrelated2 = refract(unrelated1, unrelated0, distance(unrelated0, unrelated1));\n\tv_unrelated = a_input + 0.02 * ${NORMALIZE_UNRELATED};\n\t${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n\t${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n\t${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n\tgl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n}\n"
                 ,(char *)pFVar4,(FormatArgumentList *)pcVar7);
      anon_unknown_1::FormatArgumentList::FormatArgumentList
                (&local_880,(FormatArgumentList *)local_70);
      pcVar3 = pcStack_638;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,pcVar3,&local_8c9);
      anon_unknown_1::FormatArgument::FormatArgument(&local_8a8,"UNRELATED_PREC",&local_8c8);
      pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(&local_880,&local_8a8);
      pcVar3 = normalizationStrUsed;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_918,pcVar3,&local_919);
      anon_unknown_1::FormatArgument::FormatArgument(&local_8f8,"MULTIPLIER",&local_918);
      pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_8f8);
      pcVar3 = normalizationStrUnrelated;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,pcVar3,&local_969);
      anon_unknown_1::FormatArgument::FormatArgument(&local_948,"NORMALIZE_USED",&local_968);
      pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_948);
      pcVar3 = local_658;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,pcVar3,&local_9b9);
      anon_unknown_1::FormatArgument::FormatArgument(&local_998,"NORMALIZE_UNRELATED",&local_9b8);
      pFVar4 = anon_unknown_1::FormatArgumentList::operator<<(pFVar4,&local_998);
      Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
                (&local_850,
                 (_anonymous_namespace_ *)
                 "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n\t${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n\t${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n\tgl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n}\n"
                 ,(char *)pFVar4,(FormatArgumentList *)pcVar7);
      pcVar7 = "Shader shares subexpression of different precision with an unrelated variable.";
      anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
                (pBVar5,pCVar2,name,
                 "Shader shares subexpression of different precision with an unrelated variable.",
                 &local_6c0,&local_850);
      local_9ba = 0;
      tcu::TestNode::addChild(node,(TestNode *)pBVar5);
      std::__cxx11::string::~string((string *)&local_850);
      anon_unknown_1::FormatArgument::~FormatArgument(&local_998);
      std::__cxx11::string::~string((string *)&local_9b8);
      std::allocator<char>::~allocator(&local_9b9);
      anon_unknown_1::FormatArgument::~FormatArgument(&local_948);
      std::__cxx11::string::~string((string *)&local_968);
      std::allocator<char>::~allocator(&local_969);
      anon_unknown_1::FormatArgument::~FormatArgument(&local_8f8);
      std::__cxx11::string::~string((string *)&local_918);
      std::allocator<char>::~allocator(&local_919);
      anon_unknown_1::FormatArgument::~FormatArgument(&local_8a8);
      std::__cxx11::string::~string((string *)&local_8c8);
      std::allocator<char>::~allocator(&local_8c9);
      anon_unknown_1::FormatArgumentList::~FormatArgumentList(&local_880);
      std::__cxx11::string::~string((string *)&local_6c0);
      anon_unknown_1::FormatArgument::~FormatArgument(&local_808);
      std::__cxx11::string::~string((string *)&local_828);
      std::allocator<char>::~allocator(&local_829);
      anon_unknown_1::FormatArgument::~FormatArgument(&local_7b8);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::allocator<char>::~allocator(&local_7d9);
      anon_unknown_1::FormatArgument::~FormatArgument(&local_768);
      std::__cxx11::string::~string((string *)&local_788);
      std::allocator<char>::~allocator(&local_789);
      anon_unknown_1::FormatArgument::~FormatArgument(&local_718);
      std::__cxx11::string::~string((string *)&local_738);
      std::allocator<char>::~allocator(&local_739);
      anon_unknown_1::FormatArgumentList::~FormatArgumentList(&local_6f0);
      std::__cxx11::string::~string((string *)&local_678);
      std::__cxx11::string::~string((string *)&local_698);
      std::allocator<char>::~allocator(&local_699);
    }
    pBVar5 = (BasicInvarianceTest *)operator_new(0xf8);
    local_a01 = 1;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_9e0,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} highp vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tv_unrelated += value;\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_a00,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} highp vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    pcVar7 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar5,pCVar2,"loop_0","Invariant value set using a loop",&local_9e0,&local_a00);
    local_a01 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_a00);
    std::__cxx11::string::~string((string *)&local_9e0);
    pBVar5 = (BasicInvarianceTest *)operator_new(0xf8);
    local_a49 = 1;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_a28,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tif (i == ${LOOP_ITERS_PARTIAL})\n\t\t\tv_unrelated = value;\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_a48,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    pcVar7 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar5,pCVar2,"loop_1","Invariant value set using a loop",&local_a28,&local_a48);
    local_a49 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_a48);
    std::__cxx11::string::~string((string *)&local_a28);
    pBVar5 = (BasicInvarianceTest *)operator_new(0xf8);
    local_a91 = 1;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_a70,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tif (i == ${LOOP_ITERS_PARTIAL})\n\t\t\tgl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n\t\telse\n\t\t\tv_unrelated = value + a_input;\n\t}\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_a90,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tif (i == ${LOOP_ITERS_PARTIAL})\n\t\t\tgl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n\t\telse\n\t\t\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\t}\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    pcVar7 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar5,pCVar2,"loop_2","Invariant value set using a loop",&local_a70,&local_a90);
    local_a91 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_a90);
    std::__cxx11::string::~string((string *)&local_a70);
    pBVar5 = (BasicInvarianceTest *)operator_new(0xf8);
    local_ad9 = 1;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_ab8,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tgl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n\t\tv_unrelated = gl_Position.xyzx * a_input;\n\t}\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_ad8,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tgl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n\t}\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    pcVar7 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar5,pCVar2,"loop_3","Invariant value set using a loop",&local_ab8,&local_ad8);
    local_ad9 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_ad8);
    std::__cxx11::string::~string((string *)&local_ab8);
    pBVar5 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_b00,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 value1 = a_input;\n\t${IN_PREC} vec4 value2 = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue1 *= ${LOOP_MULTIPLIER};\n\t\tv_unrelated = v_unrelated*1.3 + a_input.xyzx * value1.xyxw;\n\t}\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue2 *= ${LOOP_MULTIPLIER};\n\t\tposition = position*1.3 + a_input.xyzx * value2.xyxw;\n\t}\n\tgl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
              (&local_b20,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 value2 = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue2 *= ${LOOP_MULTIPLIER};\n\t\tposition = position*1.3 + a_input.xyzx * value2.xyxw;\n\t}\n\tgl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n}\n"
               ,local_70,(FormatArgumentList *)pcVar7);
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar5,pCVar2,"loop_4","Invariant value set using a loop",&local_b00,&local_b20);
    tcu::TestNode::addChild(node,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_b20);
    std::__cxx11::string::~string((string *)&local_b00);
    anon_unknown_1::FormatArgumentList::~FormatArgumentList((FormatArgumentList *)local_70);
    precisionName._4_4_ = precisionName._4_4_ + 1;
    pSVar6 = (ShaderInvarianceTests *)(ulong)precisionName._4_4_;
  }
  return (int)pSVar6;
}

Assistant:

void ShaderInvarianceTests::init (void)
{
	static const struct PrecisionCase
	{
		glu::Precision	prec;
		const char*		name;

		// set literals in the glsl to be in the representable range
		const char*		highValue;		// !< highValue < maxValue
		const char*		invHighValue;
		const char*		mediumValue;	// !< mediumValue^2 < maxValue
		const char*		lowValue;		// !< lowValue^4 < maxValue
		const char*		invlowValue;
		int				loopIterations;
		int				loopPartialIterations;
		int				loopNormalizationExponent;
		const char*		loopNormalizationConstantLiteral;
		const char*		loopMultiplier;
		const char*		sumLoopNormalizationConstantLiteral;
	} precisions[] =
	{
		{ glu::PRECISION_HIGHP,		"highp",	"1.0e20",	"1.0e-20",	"1.0e14",	"1.0e9",	"1.0e-9",	14,	11,	2,	"1.0e4",	"1.9",	"1.0e3"	},
		{ glu::PRECISION_MEDIUMP,	"mediump",	"1.0e4",	"1.0e-4",	"1.0e2",	"1.0e1",	"1.0e-1",	13,	11,	2,	"1.0e4",	"1.9",	"1.0e3"	},
		{ glu::PRECISION_LOWP,		"lowp",		"0.9",		"1.1",		"1.1",		"1.15",		"0.87",		6,	2,	0,	"2.0",		"1.1",	"1.0"	},
	};

	for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); ++precNdx)
	{
		const char* const			precisionName	= precisions[precNdx].name;
		const glu::Precision		precision		= precisions[precNdx].prec;
		tcu::TestCaseGroup* const	group			= new tcu::TestCaseGroup(m_testCtx, precisionName, "Invariance tests using the given precision.");

		const FormatArgumentList	args			= FormatArgumentList()
														<< FormatArgument("VERSION",				"#version 300 es\n")
														<< FormatArgument("IN",						"in")
														<< FormatArgument("OUT",					"out")
														<< FormatArgument("IN_PREC",				precisionName)
														<< FormatArgument("HIGH_VALUE",				de::toString(precisions[precNdx].highValue))
														<< FormatArgument("HIGH_VALUE_INV",			de::toString(precisions[precNdx].invHighValue))
														<< FormatArgument("MEDIUM_VALUE",			de::toString(precisions[precNdx].mediumValue))
														<< FormatArgument("LOW_VALUE",				de::toString(precisions[precNdx].lowValue))
														<< FormatArgument("LOW_VALUE_INV",			de::toString(precisions[precNdx].invlowValue))
														<< FormatArgument("LOOP_ITERS",				de::toString(precisions[precNdx].loopIterations))
														<< FormatArgument("LOOP_ITERS_PARTIAL",		de::toString(precisions[precNdx].loopPartialIterations))
														<< FormatArgument("LOOP_NORM_FRACT_EXP",	de::toString(precisions[precNdx].loopNormalizationExponent))
														<< FormatArgument("LOOP_NORM_LITERAL",		precisions[precNdx].loopNormalizationConstantLiteral)
														<< FormatArgument("LOOP_MULTIPLIER",		precisions[precNdx].loopMultiplier)
														<< FormatArgument("SUM_LOOP_NORM_LITERAL",	precisions[precNdx].sumLoopNormalizationConstantLiteral);

		addChild(group);

		// subexpression cases
		{
			// First shader shares "${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy" with unrelated output variable. Reordering might result in accuracy loss
			// due to the high exponent. In the second shader, the high exponent may be removed during compilation.

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_0", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	v_unrelated = a_input.xzxz + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * (1.08 * a_input.zyzy * a_input.xzxz) * ${HIGH_VALUE_INV} * (a_input.z * a_input.zzxz - a_input.z * a_input.zzxz) + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) / ${HIGH_VALUE};\n"
							"	gl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	gl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n"
							"}\n", args)));

			// In the first shader, the unrelated variable "d" has mathematically the same expression as "e", but the different
			// order of calculation might cause different results.

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_1", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 a = ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy - ${HIGH_VALUE} * a_input.zzxx;\n"
							"	${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n"
							"	${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n"
							"	${IN_PREC} vec4 d = (${LOW_VALUE} * a_input.yzxx) * (${LOW_VALUE} * a_input.yzzw) * (1.1*${LOW_VALUE_INV} * a_input.yzxx) * (${LOW_VALUE_INV} * a_input.xzzy);\n"
							"	${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n"
							"	v_unrelated = a + b + c + d + e;\n"
							"	gl_Position = a_input + fract(c) + e;\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n"
							"	${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n"
							"	${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	gl_Position = a_input + fract(c) + e;\n"
							"}\n", args)));

			// Intermediate values used by an unrelated output variable

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_2", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n"
							"	${IN_PREC} vec4 b = (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) * (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n"
							"	${IN_PREC} vec4 c = a * a;\n"
							"	${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n"
							"	v_unrelated = a + b + c + d;\n"
							"	gl_Position = a_input + d;\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n"
							"	${IN_PREC} vec4 c = a * a;\n"
							"	${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	gl_Position = a_input + d;\n"
							"}\n", args)));

			// Invariant value can be calculated using unrelated value

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_3", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} float x = a_input.x * 0.2;\n"
							"	${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n"
							"	${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n"
							"	${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n"
							"	${IN_PREC} vec4 f = x*a + x*b + x*c;\n"
							"	v_unrelated = f;\n"
							"	${IN_PREC} vec4 g = x * (a + b + c);\n"
							"	gl_Position = a_input + g;\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} float x = a_input.x * 0.2;\n"
							"	${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n"
							"	${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n"
							"	${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	${IN_PREC} vec4 g = x * (a + b + c);\n"
							"	gl_Position = a_input + g;\n"
							"}\n", args)));
		}

		// shared subexpression of different precision
		{
			for (int precisionOther = glu::PRECISION_LOWP; precisionOther != glu::PRECISION_LAST; ++precisionOther)
			{
				const char* const		unrelatedPrec				= glu::getPrecisionName((glu::Precision)precisionOther);
				const glu::Precision	minPrecision				= (precisionOther < (int)precision) ? ((glu::Precision)precisionOther) : (precision);
				const char* const		multiplierStr				= (minPrecision == glu::PRECISION_LOWP) ? ("0.8, 0.4, -0.2, 0.3") : ("1.0e1, 5.0e2, 2.0e2, 1.0");
				const char* const		normalizationStrUsed		= (minPrecision == glu::PRECISION_LOWP) ? ("vec4(fract(used2).xyz, 0.0)") : ("vec4(fract(used2 / 1.0e2).xyz - fract(used2 / 1.0e3).xyz, 0.0)");
				const char* const		normalizationStrUnrelated	= (minPrecision == glu::PRECISION_LOWP) ? ("vec4(fract(unrelated2).xyz, 0.0)") : ("vec4(fract(unrelated2 / 1.0e2).xyz - fract(unrelated2 / 1.0e3).xyz, 0.0)");

				group->addChild(new BasicInvarianceTest(m_context, ("subexpression_precision_" + std::string(unrelatedPrec)).c_str(), "Shader shares subexpression of different precision with an unrelated variable.",
					formatGLSL(	"${VERSION}"
								"${IN} ${IN_PREC} vec4 a_input;\n"
								"${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\n"
								"invariant gl_Position;\n"
								"void main ()\n"
								"{\n"
								"	${UNRELATED_PREC} vec4 unrelated0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n"
								"	${UNRELATED_PREC} vec4 unrelated1 = vec4(${MULTIPLIER}) * unrelated0.xywz + unrelated0;\n"
								"	${UNRELATED_PREC} vec4 unrelated2 = refract(unrelated1, unrelated0, distance(unrelated0, unrelated1));\n"
								"	v_unrelated = a_input + 0.02 * ${NORMALIZE_UNRELATED};\n"
								"	${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n"
								"	${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n"
								"	${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n"
								"	gl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n"
								"}\n", FormatArgumentList(args)
											<< FormatArgument("UNRELATED_PREC",			unrelatedPrec)
											<< FormatArgument("MULTIPLIER",				multiplierStr)
											<< FormatArgument("NORMALIZE_USED",			normalizationStrUsed)
											<< FormatArgument("NORMALIZE_UNRELATED",	normalizationStrUnrelated)),
					formatGLSL(	"${VERSION}"
								"${IN} ${IN_PREC} vec4 a_input;\n"
								"${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\n"
								"invariant gl_Position;\n"
								"void main ()\n"
								"{\n"
								"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
								"	${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n"
								"	${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n"
								"	${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n"
								"	gl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n"
								"}\n", FormatArgumentList(args)
											<< FormatArgument("UNRELATED_PREC",			unrelatedPrec)
											<< FormatArgument("MULTIPLIER",				multiplierStr)
											<< FormatArgument("NORMALIZE_USED",			normalizationStrUsed)
											<< FormatArgument("NORMALIZE_UNRELATED",	normalizationStrUnrelated))));
			}
		}

		// loops
		{
			group->addChild(new BasicInvarianceTest(m_context, "loop_0", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} highp vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		v_unrelated += value;\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} highp vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_1", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		if (i == ${LOOP_ITERS_PARTIAL})\n"
							"			v_unrelated = value;\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_2", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		if (i == ${LOOP_ITERS_PARTIAL})\n"
							"			gl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"		else\n"
							"			v_unrelated = value + a_input;\n"
							"	}\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		if (i == ${LOOP_ITERS_PARTIAL})\n"
							"			gl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"		else\n"
							"			v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	}\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_3", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		gl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"		v_unrelated = gl_Position.xyzx * a_input;\n"
							"	}\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		gl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"	}\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_4", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	${IN_PREC} vec4 value1 = a_input;\n"
							"	${IN_PREC} vec4 value2 = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value1 *= ${LOOP_MULTIPLIER};\n"
							"		v_unrelated = v_unrelated*1.3 + a_input.xyzx * value1.xyxw;\n"
							"	}\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value2 *= ${LOOP_MULTIPLIER};\n"
							"		position = position*1.3 + a_input.xyzx * value2.xyxw;\n"
							"	}\n"
							"	gl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	${IN_PREC} vec4 value2 = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value2 *= ${LOOP_MULTIPLIER};\n"
							"		position = position*1.3 + a_input.xyzx * value2.xyxw;\n"
							"	}\n"
							"	gl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"}\n", args)));
		}
	}
}